

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O1

bool __thiscall
Js::SimpleTypeHandler<6UL>::IsObjTypeSpecEquivalent
          (SimpleTypeHandler<6UL> *this,Type *type,TypeEquivalenceRecord *record,
          uint *failedPropertyIndex)

{
  bool bVar1;
  EquivalentPropertyEntry *entry;
  ulong uVar2;
  bool bVar3;
  
  bVar3 = record->propertyCount == 0;
  if (!bVar3) {
    entry = record->properties;
    bVar1 = IsObjTypeSpecEquivalent(this,type,entry);
    uVar2 = 0;
    if (bVar1) {
      uVar2 = 0;
      do {
        entry = entry + 1;
        uVar2 = uVar2 + 1;
        bVar3 = record->propertyCount <= uVar2;
        if (bVar3) {
          return bVar3;
        }
        bVar1 = IsObjTypeSpecEquivalent(this,type,entry);
      } while (bVar1);
    }
    *failedPropertyIndex = (uint)uVar2;
  }
  return bVar3;
}

Assistant:

bool SimpleTypeHandler<size>::IsObjTypeSpecEquivalent(const Type* type, const TypeEquivalenceRecord& record, uint& failedPropertyIndex)
    {
        Js::EquivalentPropertyEntry* properties = record.properties;
        for (uint pi = 0; pi < record.propertyCount; pi++)
        {
            const EquivalentPropertyEntry* refInfo = &properties[pi];
            if (!this->SimpleTypeHandler<size>::IsObjTypeSpecEquivalent(type, refInfo))
            {
                failedPropertyIndex = pi;
                return false;
            }
        }

        return true;
    }